

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O1

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormalsLocalScheme
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *ppvVar1;
  ParameterSet *pPVar2;
  pointer pVVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  GuidedMeshNormalFiltering *pGVar7;
  pointer *centroid;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  FaceIter FVar17;
  GuidedMeshNormalFiltering local_190;
  undefined1 local_178 [8];
  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  range_and_mean_normal;
  double multiple_radius;
  double multiple_sigma_s;
  double sigma_r;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_guided_neighbor;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  guided_normals;
  undefined1 local_100 [8];
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  FaceIter f_it;
  int face_neighbor_index;
  int vertex_iteration_number;
  int local_64;
  double dStack_60;
  int normal_iteration_number;
  undefined1 local_58 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  bool local_31 [8];
  bool include_central_face;
  
  iVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,(long)iVar5);
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  ppvVar1 = &all_face_neighbor.
             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (undefined1  [8])ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Face Neighbor","");
  bVar4 = ParameterSet::getValue(pPVar2,(string *)local_58,(int *)&f_it.hnd_);
  if (local_58 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_58);
  }
  if (bVar4) {
    pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
    local_58 = (undefined1  [8])ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"include central face","");
    bVar4 = ParameterSet::getValue(pPVar2,(string *)local_58,local_31);
    if (local_58 != (undefined1  [8])ppvVar1) {
      operator_delete((void *)local_58);
    }
    if (bVar4) {
      pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
      local_58 = (undefined1  [8])ppvVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"Multiple(* avg face dis.)","");
      bVar4 = ParameterSet::getValue
                        (pPVar2,(string *)local_58,
                         (double *)
                         &range_and_mean_normal.
                          super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_58 != (undefined1  [8])ppvVar1) {
        operator_delete((void *)local_58);
      }
      if (bVar4) {
        pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
        local_58 = (undefined1  [8])ppvVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Multiple(* sigma_s)","")
        ;
        bVar4 = ParameterSet::getValue(pPVar2,(string *)local_58,&multiple_radius);
        if (local_58 != (undefined1  [8])ppvVar1) {
          operator_delete((void *)local_58);
        }
        if (bVar4) {
          pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
          local_58 = (undefined1  [8])ppvVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,"(Local)Normal Iteration Num.","");
          bVar4 = ParameterSet::getValue(pPVar2,(string *)local_58,&local_64);
          if (local_58 != (undefined1  [8])ppvVar1) {
            operator_delete((void *)local_58);
          }
          if (bVar4) {
            pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
            local_58 = (undefined1  [8])ppvVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"sigma_r","");
            bVar4 = ParameterSet::getValue(pPVar2,(string *)local_58,&multiple_sigma_s);
            if (local_58 != (undefined1  [8])ppvVar1) {
              operator_delete((void *)local_58);
            }
            if (bVar4) {
              pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
              local_58 = (undefined1  [8])ppvVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_58,"Vertex Iteration Num.","");
              bVar4 = ParameterSet::getValue(pPVar2,(string *)local_58,(int *)&f_it.skip_bits_);
              if (local_58 != (undefined1  [8])ppvVar1) {
                operator_delete((void *)local_58);
              }
              if (bVar4) {
                if (f_it.hnd_.super_BaseHandle.idx_ == 0) {
                  dStack_60 = getRadius(this,(double)range_and_mean_normal.
                                                                                                          
                                                  super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        ,mesh);
                }
                iVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          *)local_58,(long)iVar5,(allocator_type *)&sigma_r);
                getAllFaceNeighborGMNF
                          (this,mesh,(uint)(f_it.hnd_.super_BaseHandle.idx_ == 0) * 2,dStack_60,
                           local_31[0],
                           (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)local_58);
                iVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          *)&sigma_r,(long)iVar5,(allocator_type *)local_100);
                getAllGuidedNeighborGMNF
                          (this,mesh,
                           (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)&sigma_r);
                MeshDenoisingBase::getFaceNormal
                          (&this->super_MeshDenoisingBase,mesh,filtered_normals);
                iVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)local_100,(long)iVar5,
                           (allocator_type *)
                           &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                iVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)iVar5,
                         (allocator_type *)
                         &face_centroid.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&face_centroid.
                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar5,
                         (allocator_type *)
                         &all_guided_neighbor.
                          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&all_guided_neighbor.
                             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar5,
                         (allocator_type *)local_178);
                iVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          *)local_178,(long)iVar5,
                         (allocator_type *)
                         &previous_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (0 < local_64) {
                  iVar5 = 0;
                  do {
                    centroid = &face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
                    pGVar7 = this;
                    MeshDenoisingBase::getFaceCentroid
                              (&this->super_MeshDenoisingBase,mesh,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)centroid);
                    dVar10 = getSigmaS(pGVar7,multiple_radius,
                                       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        *)centroid,mesh);
                    MeshDenoisingBase::getFaceArea
                              (&this->super_MeshDenoisingBase,mesh,
                               (vector<double,_std::allocator<double>_> *)local_100);
                    MeshDenoisingBase::getFaceNormal
                              (&this->super_MeshDenoisingBase,mesh,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)&face_centroid.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    pGVar7 = &local_190;
                    std::
                    vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                    ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                              *)pGVar7,
                             (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                              *)local_178);
                    getGuidedNormals(pGVar7,mesh,
                                     (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                      *)&sigma_r,
                                     (vector<double,_std::allocator<double>_> *)local_100,
                                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)&face_centroid.
                                         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                      *)&local_190,
                                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)&all_guided_neighbor.
                                         super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (local_190.super_MeshDenoisingBase._vptr_MeshDenoisingBase !=
                        (_func_int **)0x0) {
                      operator_delete(local_190.super_MeshDenoisingBase._vptr_MeshDenoisingBase);
                    }
                    join_0x00000010_0x00000000_ =
                         OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
                    while( true ) {
                      FVar17 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
                      if (f_it.mesh_._0_4_ == (BaseHandle)FVar17.hnd_.super_BaseHandle.idx_ &&
                          (mesh_ptr)
                          face_neighbor.
                          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == FVar17.mesh_) break;
                      lVar6 = (long)(int)f_it.mesh_._0_4_;
                      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                      vector((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                             &previous_normals.
                              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                             ((long)local_58 + lVar6 * 0x18));
                      if ((int)((ulong)((long)face_neighbor.
                                              super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)previous_normals.
                                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) >>
                               2) < 1) {
                        dVar15 = 0.0;
                        dVar16 = 0.0;
                        dVar12 = 0.0;
                      }
                      else {
                        dVar12 = 0.0;
                        lVar9 = 0;
                        dVar16 = 0.0;
                        dVar15 = 0.0;
                        do {
                          lVar8 = (long)*(int *)((long)((previous_normals.
                                                                                                                  
                                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->super_VectorDataT<double,_3>).values_ +
                                                lVar9 * 4);
                          dVar11 = (face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage[lVar6 * 3 + 2]
                                   - face_area.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage
                                     [lVar8 * 3 + 2]) *
                                   (face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage[lVar6 * 3 + 2]
                                   - face_area.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage
                                     [lVar8 * 3 + 2]) +
                                   (face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage[lVar6 * 3] -
                                   face_area.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage[lVar8 * 3]) *
                                   (face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage[lVar6 * 3] -
                                   face_area.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage[lVar8 * 3]) +
                                   (face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage[lVar6 * 3 + 1]
                                   - face_area.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage
                                     [lVar8 * 3 + 1]) *
                                   (face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage[lVar6 * 3 + 1]
                                   - face_area.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage
                                     [lVar8 * 3 + 1]);
                          dStack_60 = dVar12;
                          if (dVar11 < 0.0) {
                            dVar11 = sqrt(dVar11);
                          }
                          else {
                            dVar11 = SQRT(dVar11);
                          }
                          dVar12 = exp((dVar11 * -0.5 * dVar11) / (dVar10 * dVar10));
                          dVar13 = (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar6]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                   (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar8]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                          dVar14 = (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar6]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                   (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar8]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                          dVar11 = (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar6]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar8]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          dVar11 = dVar11 * dVar11 + dVar13 * dVar13 + dVar14 * dVar14;
                          if (dVar11 < 0.0) {
                            dVar11 = sqrt(dVar11);
                          }
                          else {
                            dVar11 = SQRT(dVar11);
                          }
                          dVar11 = exp((dVar11 * -0.5 * dVar11) /
                                       (multiple_sigma_s * multiple_sigma_s));
                          dVar11 = dVar12 * *(double *)((long)local_100 + lVar8 * 8) * dVar11;
                          dVar15 = dVar15 + face_centroid.
                                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            [lVar8].super_VectorDataT<double,_3>.values_[0] * dVar11
                          ;
                          dVar16 = dVar16 + face_centroid.
                                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            [lVar8].super_VectorDataT<double,_3>.values_[1] * dVar11
                          ;
                          dVar12 = dStack_60 +
                                   dVar11 * face_centroid.
                                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            [lVar8].super_VectorDataT<double,_3>.values_[2];
                          lVar9 = lVar9 + 1;
                        } while (lVar9 < (int)((ulong)((long)face_neighbor.
                                                                                                                          
                                                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                                  (long)previous_normals.
                                                                                                                
                                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ) >> 2));
                      }
                      if ((pointer)face_neighbor.
                                   super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_start !=
                          previous_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        dVar11 = dVar12 * dVar12 + dVar15 * dVar15 + dVar16 * dVar16;
                        if (dVar11 < 0.0) {
                          dStack_60 = dVar12;
                          dVar11 = sqrt(dVar11);
                          dVar12 = dStack_60;
                        }
                        else {
                          dVar11 = SQRT(dVar11);
                        }
                        pVVar3 = (filtered_normals->
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        pVVar3[lVar6].super_VectorDataT<double,_3>.values_[0] = dVar15 / dVar11;
                        pVVar3[lVar6].super_VectorDataT<double,_3>.values_[1] = dVar16 / dVar11;
                        pVVar3[lVar6].super_VectorDataT<double,_3>.values_[2] = dVar12 / dVar11;
                      }
                      if (previous_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                        operator_delete(previous_normals.
                                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                      f_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)f_it.mesh_._0_4_ + 1);
                      if (f_it.mesh_._4_4_ != 0) {
                        OpenMesh::Iterators::
                        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                    *)&face_neighbor.
                                       super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                    }
                    MeshDenoisingBase::updateVertexPosition
                              (&this->super_MeshDenoisingBase,mesh,filtered_normals,f_it.skip_bits_,
                               false);
                    iVar5 = iVar5 + 1;
                  } while (iVar5 < local_64);
                }
                if (local_178 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_178);
                }
                if (all_guided_neighbor.
                    super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  operator_delete(all_guided_neighbor.
                                  super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                if (face_centroid.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  operator_delete(face_centroid.
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                if (face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  operator_delete(face_area.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                if (local_100 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_100);
                }
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           *)&sigma_r);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           *)local_58);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormalsLocalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize((int)mesh.n_faces());
    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    bool include_central_face;
    if(!parameter_set_->getValue(string("include central face"), include_central_face))
        return;
    double multiple_radius;
    if(!parameter_set_->getValue(string("Multiple(* avg face dis.)"), multiple_radius))
        return;
    double multiple_sigma_s;
    if(!parameter_set_->getValue(string("Multiple(* sigma_s)"), multiple_sigma_s))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("(Local)Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_r;
    if(!parameter_set_->getValue(string("sigma_r"), sigma_r))
        return;
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = face_neighbor_index == 0 ? kRadiusBased : kVertexBased;

    double radius;
    if(face_neighbor_type == kRadiusBased)
        radius = getRadius(multiple_radius, mesh);

    std::vector<std::vector<TriMesh::FaceHandle> > all_face_neighbor((int)mesh.n_faces());
    getAllFaceNeighborGMNF(mesh, face_neighbor_type, radius, include_central_face, all_face_neighbor);
    std::vector<std::vector<TriMesh::FaceHandle> > all_guided_neighbor((int)mesh.n_faces());
    getAllGuidedNeighborGMNF(mesh, all_guided_neighbor);
    getFaceNormal(mesh, filtered_normals);

    std::vector<double> face_area((int)mesh.n_faces());
    std::vector<TriMesh::Point> face_centroid((int)mesh.n_faces());
    std::vector<TriMesh::Normal> previous_normals((int)mesh.n_faces());
    std::vector<TriMesh::Normal> guided_normals((int)mesh.n_faces());
    std::vector<std::pair<double, TriMesh::Normal> > range_and_mean_normal((int)mesh.n_faces());
    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        getFaceCentroid(mesh, face_centroid);
        double sigma_s = getSigmaS(multiple_sigma_s, face_centroid, mesh);
        getFaceArea(mesh, face_area);
        getFaceNormal(mesh, previous_normals);

        getGuidedNormals(mesh, all_guided_neighbor, face_area, previous_normals, range_and_mean_normal, guided_normals);

        // Filtered Face Normals
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index = f_it->idx();
            const std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index];
            TriMesh::Normal filtered_normal(0.0, 0.0, 0.0);
            for(int j = 0; j < (int)face_neighbor.size(); j++)
            {
                int current_face_index = face_neighbor[j].idx();

                double spatial_dis = (face_centroid[index] - face_centroid[current_face_index]).length();
                double spatial_weight = GaussianWeight(spatial_dis, sigma_s);
                double range_dis = (guided_normals[index] - guided_normals[current_face_index]).length();
                double range_weight = GaussianWeight(range_dis, sigma_r);

                filtered_normal += previous_normals[current_face_index] * (face_area[current_face_index] * spatial_weight * range_weight);
            }
            if(face_neighbor.size())
                filtered_normals[index] = filtered_normal.normalize();
        }

        // immediate update vertex position
        updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, false);
    }
}